

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O2

bool boost::ext::ut::v1_1_8::detail::
     on<boost::ext::ut::v1_1_8::detail::eq_<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>,boost::ext::ut::v1_1_8::events::assertion<boost::ext::ut::v1_1_8::detail::eq_<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>>
               (assertion<boost::ext::ut::v1_1_8::detail::eq_<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
                *event)

{
  bool bVar1;
  undefined8 uVar2;
  assertion_fail<boost::ext::ut::v1_1_8::detail::eq_<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  assertion;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined1 uStack_81;
  undefined7 uStack_80;
  undefined4 uStack_79;
  undefined7 uStack_47;
  undefined4 uStack_34;
  
  uVar3 = (event->expr).lhs_._M_len;
  uVar4 = (event->expr).lhs_._M_str;
  assertion.expr.lhs_._M_str = (char *)uVar4;
  assertion.expr.lhs_._M_len = uVar3;
  uVar5 = (event->expr).rhs_._M_len;
  uVar6 = (event->expr).rhs_._M_str;
  assertion.expr.rhs_._M_str = (char *)uVar6;
  assertion.expr.rhs_._M_len = uVar5;
  bVar1 = (event->expr).value_;
  bVar7 = true;
  uVar2 = *(undefined8 *)((long)&(event->location).file_ + 1);
  uStack_81 = (undefined1)((ulong)*(undefined8 *)&(event->expr).field_0x21 >> 0x38);
  uStack_80 = (undefined7)uVar2;
  uStack_79._1_3_ = (undefined3)((uint)(event->location).line_ >> 8);
  uStack_79._0_1_ = (undefined1)((ulong)uVar2 >> 0x38);
  if (cfg<boost::ext::ut::v1_1_8::override>[0x348] == '\0') {
    if ((bVar1 & 1U) == 0) {
      assertion.location.file_._1_7_ = uStack_80;
      assertion.location.file_._0_1_ = uStack_81;
      cfg<boost::ext::ut::v1_1_8::override>._528_8_ =
           cfg<boost::ext::ut::v1_1_8::override>._528_8_ + 1;
      assertion.expr._33_7_ = uStack_47;
      assertion.expr.value_ = bVar1;
      assertion.location._12_4_ = uStack_34;
      assertion.location.line_ = uStack_79;
      reporter<boost::ext::ut::v1_1_8::printer>::
      on<boost::ext::ut::v1_1_8::detail::eq_<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>>>
                ((reporter<boost::ext::ut::v1_1_8::printer> *)cfg<boost::ext::ut::v1_1_8::override>,
                 assertion);
      bVar7 = false;
    }
    else {
      cfg<boost::ext::ut::v1_1_8::override>._24_8_ =
           cfg<boost::ext::ut::v1_1_8::override>._24_8_ + 1;
    }
  }
  return bVar7;
}

Assistant:

[[nodiscard]] constexpr decltype(auto) on(TEvent&& event) {
  return ut::cfg<typename type_traits::identity<override, Ts...>::type>.on(
      static_cast<TEvent&&>(event));
}